

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  ExtendedKalmanFilter *this_00;
  IMUElasticLocalFrameDynamicalSystem *pIVar1;
  Vector *this_01;
  double *pdVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  double dVar5;
  _func_int *p_Var6;
  undefined8 uVar7;
  uint uVar8;
  Index size;
  double *pdVar9;
  undefined8 *puVar10;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar11;
  Index index_2;
  char *__function;
  Index index;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  Vector dx;
  Vector x0;
  Vector3 v2;
  Vector3 v1;
  DenseStorage<double,__1,__1,_1,_0> local_f8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_e0;
  IMUElasticLocalFrameDynamicalSystem *local_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  double local_88;
  Scalar local_80;
  Scalar local_78;
  DenseStorage<double,__1,__1,_1,_0> local_70;
  Matrix<double,_3,_1,_0,_3,_1> local_60;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  
  local_a8._0_4_ = 0x23;
  local_a8._4_4_ = 0;
  uStack_a0 = 1;
  local_98._8_8_ = local_98._0_8_;
  local_98._0_8_ = 0x3e45798ee2308c3a;
  local_88 = dt;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_a8);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x2a,(Vector *)&local_e0);
  free(local_e0.m_xpr);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_0018e558;
  pIVar1 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem(pIVar1,local_88);
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  this->stateSize_ = 0x23;
  this->unmodeledForceVariance_ = 1e-06;
  this->forceVariance_ = 0.0001;
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withComBias_ = false;
  this->withAbsolutePos_ = false;
  this->withUnmodeledForces_ = false;
  this->limitOn_ = true;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = pIVar1;
  uVar8 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(pIVar1);
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::setMeasureSize(&this_00->super_KalmanFilterBase,uVar8);
  KalmanFilterBase::setStateSize(&this_00->super_KalmanFilterBase,this->stateSize_);
  uVar8 = IMUElasticLocalFrameDynamicalSystem::getInputSize(pIVar1);
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)this_00,uVar8);
  uVar8 = IMUElasticLocalFrameDynamicalSystem::getInputSize(pIVar1);
  this->inputSize_ = uVar8;
  resetCovarianceMatrices(this);
  uVar8 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  uVar14 = (ulong)uVar8;
  local_f8.m_data = (double *)0x0;
  local_f8.m_rows = 0;
  pdVar9 = local_f8.m_data;
  uVar12 = local_f8.m_rows;
  if (uVar14 != 0) {
    free((void *)0x0);
    uVar12 = uVar14;
    if (uVar8 == 0) {
      pdVar9 = (double *)0x0;
    }
    else {
      pdVar9 = (double *)malloc(uVar14 * 8);
      if ((uVar8 != 1) && (((ulong)pdVar9 & 0xf) != 0)) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar9 == (double *)0x0) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = std::ios::widen;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_f8.m_rows = uVar12;
  local_f8.m_data = pdVar9;
  pIVar1 = local_c0;
  if (local_f8.m_rows != uVar14) {
    __function = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
    ;
LAB_00147ea3:
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,__function);
  }
  uVar12 = local_f8.m_rows & 0xfffffffffffffffe;
  if (1 < (ulong)local_f8.m_rows) {
    lVar13 = 0;
    do {
      local_f8.m_data[lVar13] = 1e-08;
      (local_f8.m_data + lVar13)[1] = 1e-08;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar12);
  }
  if (uVar12 < (ulong)local_f8.m_rows) {
    do {
      local_f8.m_data[uVar12] = 1e-08;
      uVar12 = uVar12 + 1;
    } while (local_f8.m_rows != uVar12);
  }
  if (5 < (ulong)local_f8.m_rows) {
    pdVar9 = local_f8.m_data + 3;
    uVar12 = 3;
    if (((ulong)pdVar9 & 7) == 0) {
      uVar12 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
    }
    uVar8 = (uint)uVar12 ^ 3;
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        pdVar9[uVar14] = 0.0001;
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    uVar14 = (uVar8 & 0xfffffffe) + uVar12;
    if (1 < uVar8) {
      do {
        pdVar9[uVar12] = 0.0001;
        (pdVar9 + uVar12)[1] = 0.0001;
        uVar12 = uVar12 + 2;
      } while (uVar12 < uVar14);
    }
    if ((uint)uVar14 < 3) {
      do {
        pdVar9[uVar14] = 0.0001;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 3);
    }
    if (0xb < (ulong)local_f8.m_rows) {
      pdVar9 = local_f8.m_data + 9;
      uVar12 = 3;
      if (((ulong)pdVar9 & 7) == 0) {
        uVar12 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
      }
      uVar8 = (uint)uVar12 ^ 3;
      if (uVar12 != 0) {
        uVar14 = 0;
        do {
          pdVar9[uVar14] = 0.0001;
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      uVar14 = (uVar8 & 0xfffffffe) + uVar12;
      if (1 < uVar8) {
        do {
          pdVar9[uVar12] = 0.0001;
          (pdVar9 + uVar12)[1] = 0.0001;
          uVar12 = uVar12 + 2;
        } while (uVar12 < uVar14);
      }
      if ((uint)uVar14 < 3) {
        do {
          pdVar9[uVar14] = 0.0001;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 3);
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_70,&local_f8);
      EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
                (&this->super_EKFFlexibilityEstimatorBase,(Vector *)&local_70);
      free(local_70.m_data);
      ObserverBase::stateVectorZero((ObserverBase *)local_b8);
      uVar7 = local_b8._0_8_;
      this_01 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
      if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          local_b8._8_8_) {
        if ((long)local_b8._8_8_ < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)this_01,local_b8._8_8_,local_b8._8_8_,1);
      }
      uVar12 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (uVar12 == local_b8._8_8_) {
        pdVar9 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        uVar14 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar12) {
          lVar13 = 0;
          do {
            pp_Var3 = (_func_int **)(uVar7 + lVar13 * 8);
            p_Var6 = pp_Var3[1];
            pdVar2 = pdVar9 + lVar13;
            *pdVar2 = (double)*pp_Var3;
            pdVar2[1] = (double)p_Var6;
            lVar13 = lVar13 + 2;
          } while (lVar13 < (long)uVar14);
        }
        if ((long)uVar14 < (long)uVar12) {
          do {
            pdVar9[uVar14] = (double)*(_func_int **)(uVar7 + uVar14 * 8);
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)local_b8,0);
        KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->Q_);
        ExtendedKalmanFilter::setFunctor(this_00,&pIVar1->super_DynamicalSystemFunctorBase);
        IMUElasticLocalFrameDynamicalSystem::setFDstep
                  (pIVar1,&(this->super_EKFFlexibilityEstimatorBase).dx_);
        this->on_ = true;
        local_e0.m_xpr = &local_48;
        local_e0.m_row = 0;
        local_e0.m_col = 1;
        local_e0.m_currentBlockRows = 1;
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = 100.0;
        local_78 = 100.0;
        pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                            (&local_e0,&local_78);
        local_80 = 1000.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar11,&local_80)
        ;
        if ((local_e0.m_currentBlockRows + local_e0.m_row == 3) && (local_e0.m_col == 1)) {
          local_e0.m_xpr = &local_60;
          local_e0.m_row = 0;
          local_e0.m_col = 1;
          local_e0.m_currentBlockRows = 1;
          local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = 10.0;
          local_78 = 10.0;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              (&local_e0,&local_78);
          local_80 = 100.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                    (pCVar11,&local_80);
          if ((local_e0.m_currentBlockRows + local_e0.m_row == 3) && (local_e0.m_col == 1)) {
            local_a8._0_4_ = 0;
            local_a8._4_4_ = 0;
            uStack_a0 = 0;
            local_98._12_4_ = 0;
            local_98._0_12_ = ZEXT812(0x4081651eb851eb85);
            (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] =
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 0.0 +
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 0.0 +
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 556.64;
            (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] =
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 0.0 +
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 556.64 +
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 0.0;
            (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] =
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 556.64 +
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 0.0 +
                 local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 0.0;
            dVar5 = local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] * 0.0 +
                    local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1] * 556.64 +
                    local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0] * 0.0;
            auVar4._8_4_ = SUB84(dVar5,0);
            auVar4._0_8_ = local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2] * 0.0 +
                           local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[1] * 0.0 +
                           local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] * 556.64;
            auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
            *(undefined1 (*) [16])
             (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array = auVar4;
            (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] =
                 local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 556.64 +
                 local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 0.0 +
                 local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 0.0;
            free((void *)local_b8._0_8_);
            free(local_f8.m_data);
            return;
          }
        }
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                     );
      }
      __function = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
      goto LAB_00147ea3;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt):
        EKFFlexibilityEstimatorBase
            (stateSize,measurementSizeBase_,inputSizeBase_,
                            Matrix::Constant(stateSize,1,dxFactor)),
        functor_(dt),
        stateSize_(stateSize),
        unmodeledForceVariance_(1e-6),
        forceVariance_(1e-4),
        absPosVariance_(1e-4),
        useFTSensors_(false),
        withAbsolutePos_(false),
        withComBias_(false),
        withUnmodeledForces_(false),
        limitOn_(true)
    {
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setStateSize(stateSize_);
        ekf_.setInputSize(functor_.getInputSize());
        inputSize_=functor_.getInputSize();

        ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

        Vector dx(Matrix::Constant(getStateSize(),1,dxFactor));

        dx.segment(state::ori,3).fill(1e-4) ;
        dx.segment(state::angVel,3).fill(1e-4) ;

        ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

        Vector x0(ekf_.stateVectorZero());

        lastX_=x0;
        ekf_.setState(x0,0);

        ekf_.setStateCovariance(Q_);

        ekf_.setFunctor(& functor_);

        functor_.setFDstep(dx_);

        on_=true;

        Vector3 v1, v2;
        Matrix3 v;
        v1 << 100,
              100,
              1000;
        v2 << 10,
              10,
              100;
        v.setIdentity();
        v*=cst::gravityConstant*hrp2::m;
        limitForces_=v*v1;
        limitTorques_=v*v2;

    }